

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  int iVar22;
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  int iVar41;
  undefined1 auVar40 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar44 [16];
  int sizes [17];
  int next_code [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  int aiStack_78 [18];
  
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_88 = 0;
  memset(z,0,0x400);
  if (0 < num) {
    uVar13 = 0;
    do {
      *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) =
           *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) + 1;
      uVar13 = uVar13 + 1;
    } while ((uint)num != uVar13);
  }
  lVar14 = 1;
  pcVar15 = "bad sizes";
  do {
    if (1 << ((byte)lVar14 & 0x1f) < *(int *)(local_c8 + lVar14 * 4)) goto LAB_00134ca1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  lVar14 = 0;
  bVar9 = 0xf;
  pcVar15 = "bad codelengths";
  iVar18 = 0;
  iVar19 = 0;
  while( true ) {
    aiStack_78[lVar14 + 1] = iVar19;
    z->firstcode[lVar14 + 1] = (stbi__uint16)iVar19;
    z->firstsymbol[lVar14 + 1] = (stbi__uint16)iVar18;
    iVar22 = *(int *)(local_c8 + lVar14 * 4 + 4);
    iVar19 = iVar19 + iVar22;
    if ((iVar22 != 0) && (1 << ((char)lVar14 + 1U & 0x1f) < iVar19)) break;
    z->maxcode[lVar14 + 1] = iVar19 << (bVar9 & 0x1f);
    iVar19 = iVar19 * 2;
    iVar18 = iVar18 + iVar22;
    bVar9 = bVar9 - 1;
    lVar14 = lVar14 + 1;
    if (lVar14 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      auVar8 = _DAT_0015d3e0;
      auVar7 = _DAT_0015d3d0;
      auVar6 = _DAT_0015d3c0;
      auVar5 = _DAT_0015d3b0;
      auVar4 = _DAT_0013b410;
      if (0 < num) {
        uVar13 = 0;
        do {
          bVar9 = sizelist[uVar13];
          if (bVar9 != 0) {
            iVar19 = aiStack_78[bVar9];
            lVar14 = (long)(int)(iVar19 - (uint)z->firstcode[bVar9]) + (ulong)z->firstsymbol[bVar9];
            z->size[lVar14] = bVar9;
            z->value[lVar14] = (ushort)uVar13;
            if ((bVar9 < 10) &&
               (uVar10 = (ushort)iVar19 << 8 | (ushort)iVar19 >> 8,
               uVar11 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4,
               uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4,
               uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2 >> (0x10 - bVar9 & 0x1f),
               uVar11 < 0x200)) {
              uVar10 = (ushort)uVar13 | (ushort)bVar9 << 9;
              lVar14 = 1L << (bVar9 & 0x3f);
              uVar12 = lVar14 + (ulong)uVar11;
              uVar17 = (ulong)(uVar12 < 0x200);
              uVar20 = 0x200;
              if (0x200 < uVar12) {
                uVar20 = uVar12;
              }
              uVar20 = (uVar20 - uVar17) - uVar12 >> (bVar9 & 0x3f);
              lVar16 = uVar17 + uVar20;
              auVar21._8_4_ = (int)lVar16;
              auVar21._0_8_ = lVar16;
              auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar21 = auVar21 ^ auVar4;
              uVar12 = 0;
              do {
                lVar16 = (uVar12 << (bVar9 & 0x3f)) + (ulong)uVar11;
                auVar33._8_4_ = (int)uVar12;
                auVar33._0_8_ = uVar12;
                auVar33._12_4_ = (int)(uVar12 >> 0x20);
                auVar25 = (auVar33 | auVar8) ^ auVar4;
                iVar18 = auVar21._0_4_;
                iVar39 = -(uint)(iVar18 < auVar25._0_4_);
                iVar22 = auVar21._4_4_;
                auVar26._4_4_ = -(uint)(iVar22 < auVar25._4_4_);
                iVar38 = auVar21._8_4_;
                iVar41 = -(uint)(iVar38 < auVar25._8_4_);
                iVar23 = auVar21._12_4_;
                auVar26._12_4_ = -(uint)(iVar23 < auVar25._12_4_);
                auVar35._4_4_ = iVar39;
                auVar35._0_4_ = iVar39;
                auVar35._8_4_ = iVar41;
                auVar35._12_4_ = iVar41;
                auVar42 = pshuflw(in_XMM11,auVar35,0xe8);
                auVar28._4_4_ = -(uint)(auVar25._4_4_ == iVar22);
                auVar28._12_4_ = -(uint)(auVar25._12_4_ == iVar23);
                auVar28._0_4_ = auVar28._4_4_;
                auVar28._8_4_ = auVar28._12_4_;
                auVar44 = pshuflw(in_XMM12,auVar28,0xe8);
                auVar26._0_4_ = auVar26._4_4_;
                auVar26._8_4_ = auVar26._12_4_;
                auVar43 = pshuflw(auVar42,auVar26,0xe8);
                auVar25._8_4_ = 0xffffffff;
                auVar25._0_8_ = 0xffffffffffffffff;
                auVar25._12_4_ = 0xffffffff;
                auVar25 = (auVar43 | auVar44 & auVar42) ^ auVar25;
                auVar25 = packssdw(auVar25,auVar25);
                if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar16] = uVar10;
                }
                auVar26 = auVar28 & auVar35 | auVar26;
                auVar25 = packssdw(auVar26,auVar26);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar25 = packssdw(auVar25 ^ auVar43,auVar25 ^ auVar43);
                if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
                  z->fast[lVar16 + lVar14] = uVar10;
                }
                auVar25 = (auVar33 | auVar7) ^ auVar4;
                iVar39 = -(uint)(iVar18 < auVar25._0_4_);
                auVar40._4_4_ = -(uint)(iVar22 < auVar25._4_4_);
                iVar41 = -(uint)(iVar38 < auVar25._8_4_);
                auVar40._12_4_ = -(uint)(iVar23 < auVar25._12_4_);
                auVar27._4_4_ = iVar39;
                auVar27._0_4_ = iVar39;
                auVar27._8_4_ = iVar41;
                auVar27._12_4_ = iVar41;
                auVar34._4_4_ = -(uint)(auVar25._4_4_ == iVar22);
                auVar34._12_4_ = -(uint)(auVar25._12_4_ == iVar23);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar25 = auVar34 & auVar27 | auVar40;
                auVar25 = packssdw(auVar25,auVar25);
                auVar1._8_4_ = 0xffffffff;
                auVar1._0_8_ = 0xffffffffffffffff;
                auVar1._12_4_ = 0xffffffff;
                auVar25 = packssdw(auVar25 ^ auVar1,auVar25 ^ auVar1);
                if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar14 * 2 + lVar16] = uVar10;
                }
                auVar28 = pshufhw(auVar27,auVar27,0x84);
                auVar35 = pshufhw(auVar34,auVar34,0x84);
                auVar26 = pshufhw(auVar28,auVar40,0x84);
                auVar29._8_4_ = 0xffffffff;
                auVar29._0_8_ = 0xffffffffffffffff;
                auVar29._12_4_ = 0xffffffff;
                auVar29 = (auVar26 | auVar35 & auVar28) ^ auVar29;
                auVar28 = packssdw(auVar29,auVar29);
                if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar16 + (3L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar28 = (auVar33 | auVar6) ^ auVar4;
                iVar39 = -(uint)(iVar18 < auVar28._0_4_);
                auVar31._4_4_ = -(uint)(iVar22 < auVar28._4_4_);
                iVar41 = -(uint)(iVar38 < auVar28._8_4_);
                auVar31._12_4_ = -(uint)(iVar23 < auVar28._12_4_);
                auVar36._4_4_ = iVar39;
                auVar36._0_4_ = iVar39;
                auVar36._8_4_ = iVar41;
                auVar36._12_4_ = iVar41;
                auVar25 = pshuflw(auVar25,auVar36,0xe8);
                auVar30._4_4_ = -(uint)(auVar28._4_4_ == iVar22);
                auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar23);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                in_XMM12 = pshuflw(auVar44 & auVar42,auVar30,0xe8);
                in_XMM12 = in_XMM12 & auVar25;
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar25 = pshuflw(auVar25,auVar31,0xe8);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar25 | in_XMM12) ^ auVar42;
                in_XMM11 = packssdw(auVar42,auVar42);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar16 + lVar14 * 4] = uVar10;
                }
                auVar31 = auVar30 & auVar36 | auVar31;
                auVar25 = packssdw(auVar31,auVar31);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar25 = packssdw(auVar25 ^ auVar44,auVar25 ^ auVar44);
                if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  z->fast[lVar16 + (5L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar25 = (auVar33 | auVar5) ^ auVar4;
                iVar18 = -(uint)(iVar18 < auVar25._0_4_);
                auVar37._4_4_ = -(uint)(iVar22 < auVar25._4_4_);
                iVar38 = -(uint)(iVar38 < auVar25._8_4_);
                auVar37._12_4_ = -(uint)(iVar23 < auVar25._12_4_);
                auVar32._4_4_ = iVar18;
                auVar32._0_4_ = iVar18;
                auVar32._8_4_ = iVar38;
                auVar32._12_4_ = iVar38;
                auVar24._4_4_ = -(uint)(auVar25._4_4_ == iVar22);
                auVar24._12_4_ = -(uint)(auVar25._12_4_ == iVar23);
                auVar24._0_4_ = auVar24._4_4_;
                auVar24._8_4_ = auVar24._12_4_;
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar25 = auVar24 & auVar32 | auVar37;
                auVar25 = packssdw(auVar25,auVar25);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar25 = packssdw(auVar25 ^ auVar2,auVar25 ^ auVar2);
                if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar16 + (6L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar33 = pshufhw(auVar32,auVar32,0x84);
                auVar25 = pshufhw(auVar24,auVar24,0x84);
                auVar28 = pshufhw(auVar33,auVar37,0x84);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar25 = packssdw(auVar25 & auVar33,(auVar28 | auVar25 & auVar33) ^ auVar3);
                if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar16 + (7L << (bVar9 & 0x3f))] = uVar10;
                }
                uVar12 = uVar12 + 8;
              } while ((uVar17 + uVar20 + 8 & 0xfffffffffffffff8) != uVar12);
            }
            aiStack_78[bVar9] = iVar19 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)num);
      }
      return 1;
    }
  }
LAB_00134ca1:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar15;
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}